

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::SetDefaultFields<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  TestAllTypes *pTVar1;
  TestAllTypes *s;
  char *s_00;
  uint32_t *puVar2;
  Arena *pAVar3;
  Reflection *pRVar4;
  Descriptor *pDVar5;
  FieldDescriptor *pFVar6;
  allocator<char> local_b9;
  string local_b8;
  string_view local_98 [2];
  allocator<char> local_71;
  string local_70;
  string_view local_50;
  TestAllTypes *local_40;
  TestAllTypes *message_local;
  TestAllTypes *local_30;
  anon_union_816_1_493b367e_for_TestAllTypes_11 *local_28;
  char *local_20;
  TestAllTypes *local_18;
  anon_union_816_1_493b367e_for_TestAllTypes_11 *local_10;
  
  local_40 = message;
  proto2_unittest::TestAllTypes::set_default_int32(message,0x191);
  proto2_unittest::TestAllTypes::set_default_int64(local_40,0x192);
  proto2_unittest::TestAllTypes::set_default_uint32(local_40,0x193);
  proto2_unittest::TestAllTypes::set_default_uint64(local_40,0x194);
  proto2_unittest::TestAllTypes::set_default_sint32(local_40,0x195);
  proto2_unittest::TestAllTypes::set_default_sint64(local_40,0x196);
  proto2_unittest::TestAllTypes::set_default_fixed32(local_40,0x197);
  proto2_unittest::TestAllTypes::set_default_fixed64(local_40,0x198);
  proto2_unittest::TestAllTypes::set_default_sfixed32(local_40,0x199);
  proto2_unittest::TestAllTypes::set_default_sfixed64(local_40,0x19a);
  proto2_unittest::TestAllTypes::set_default_float(local_40,411.0);
  proto2_unittest::TestAllTypes::set_default_double(local_40,412.0);
  proto2_unittest::TestAllTypes::set_default_bool(local_40,false);
  pTVar1 = local_40;
  local_30 = local_40;
  message_local = (TestAllTypes *)anon_var_dwarf_65b1b;
  local_28 = &local_40->field_0;
  puVar2 = internal::HasBits<2>::operator[](&(local_28->_impl_)._has_bits_,0);
  s = message_local;
  *(byte *)((long)puVar2 + 3) = *(byte *)((long)puVar2 + 3) | 8;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pTVar1);
  internal::ArenaStringPtr::Set(&(pTVar1->field_0)._impl_.default_string_,(char *)s,pAVar3);
  pTVar1 = local_40;
  local_18 = local_40;
  local_20 = "416";
  local_10 = &local_40->field_0;
  puVar2 = internal::HasBits<2>::operator[](&(local_10->_impl_)._has_bits_,0);
  s_00 = local_20;
  *(byte *)((long)puVar2 + 3) = *(byte *)((long)puVar2 + 3) | 0x10;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pTVar1);
  internal::ArenaStringPtr::SetBytes(&(pTVar1->field_0)._impl_.default_bytes_,s_00,pAVar3);
  proto2_unittest::TestAllTypes::set_default_nested_enum(local_40,TestAllTypes_NestedEnum_FOO);
  proto2_unittest::TestAllTypes::set_default_foreign_enum(local_40,FOREIGN_FOO);
  proto2_unittest::TestAllTypes::set_default_import_enum(local_40,IMPORT_FOO);
  pRVar4 = proto2_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_40;
  pDVar5 = proto2_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"default_string_piece");
  pFVar6 = Descriptor::FindFieldByName(pDVar5,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"424",&local_71);
  Reflection::SetString(pRVar4,&pTVar1->super_Message,pFVar6,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pRVar4 = proto2_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_40;
  pDVar5 = proto2_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_98,"default_cord");
  pFVar6 = Descriptor::FindFieldByName(pDVar5,local_98[0]);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"425",&local_b9);
  Reflection::SetString(pRVar4,&pTVar1->super_Message,pFVar6,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

void SetDefaultFields(TestAllTypes* message) {
  message->set_default_int32(401);
  message->set_default_int64(402);
  message->set_default_uint32(403);
  message->set_default_uint64(404);
  message->set_default_sint32(405);
  message->set_default_sint64(406);
  message->set_default_fixed32(407);
  message->set_default_fixed64(408);
  message->set_default_sfixed32(409);
  message->set_default_sfixed64(410);
  message->set_default_float(411);
  message->set_default_double(412);
  message->set_default_bool(false);
  message->set_default_string("415");
  message->set_default_bytes("416");

  message->set_default_nested_enum(TestAllTypes::FOO);
  message->set_default_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_FOO);
  message->set_default_import_enum(ImportEnum<TestAllTypes>::IMPORT_FOO);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetString(
      message,
      message->GetDescriptor()->FindFieldByName("default_string_piece"), "424");
  message->GetReflection()->SetString(
      message, message->GetDescriptor()->FindFieldByName("default_cord"),
      "425");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}